

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.h
# Opt level: O0

bool CommandIsForTitleAndDeveloper(wstring *command_name)

{
  bool bVar1;
  bool local_11;
  wstring *command_name_local;
  
  bVar1 = std::operator==(command_name,L"JP");
  local_11 = true;
  if (!bVar1) {
    bVar1 = std::operator==(command_name,L"EN");
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator==(command_name,L"FR");
      local_11 = true;
      if (!bVar1) {
        bVar1 = std::operator==(command_name,L"GE");
        local_11 = true;
        if (!bVar1) {
          bVar1 = std::operator==(command_name,L"IT");
          local_11 = true;
          if (!bVar1) {
            local_11 = std::operator==(command_name,L"SP");
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

inline bool CommandIsForTitleAndDeveloper(const std::wstring& command_name) {
    return command_name == L"JP" ||
           command_name == L"EN" ||
           command_name == L"FR" ||
           command_name == L"GE" ||
           command_name == L"IT" ||
           command_name == L"SP";
}